

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader.hpp
# Opt level: O0

uint __thiscall
duckdb::BitReader::ReadBytes<unsigned_int>(BitReader *this,uint8_t *bytes,uint8_t *remainder)

{
  byte bVar1;
  byte bVar2;
  byte *in_RDX;
  byte *in_RSI;
  uint8_t *in_RDI;
  BitReader *unaff_retaddr;
  uint8_t *in_stack_00000008;
  BitReader *in_stack_00000010;
  uint8_t i;
  uint result;
  byte local_1d;
  uint local_1c;
  uint8_t *offset;
  
  local_1c = 0;
  offset = in_RDI;
  for (local_1d = 0; local_1d < *in_RSI; local_1d = local_1d + 1) {
    bVar1 = InnerReadByte(unaff_retaddr,offset);
    local_1c = local_1c << 8 | (uint)bVar1;
  }
  bVar1 = *in_RDX;
  bVar2 = InnerRead(in_stack_00000010,in_stack_00000008,(uint8_t *)unaff_retaddr);
  *(uint *)(in_RDI + 8) = (uint)*in_RSI * 8 + (uint)*in_RDX + *(int *)(in_RDI + 8);
  return local_1c << (bVar1 & 0x1f) | (uint)bVar2;
}

Assistant:

inline T ReadBytes(const uint8_t &bytes, const uint8_t &remainder) {
		T result = 0;
		for (uint8_t i = 0; i < bytes; i++) {
			result = result << 8 | InnerReadByte(i);
		}
		result = result << remainder | InnerRead(remainder, bytes);
		index += static_cast<uint32_t>(bytes << 3) + remainder;
		return result;
	}